

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::DecimalFormat::format
          (DecimalFormat *this,int64_t number,UnicodeString *appendTo,FieldPositionIterator *posIter
          ,UErrorCode *status)

{
  short sVar1;
  int32_t offset;
  FormattedNumber output;
  UnicodeStringAppendable appendable;
  undefined1 local_40 [24];
  UnicodeString *local_28;
  
  if (((posIter == (FieldPositionIterator *)0x0) && (number + 0x7fffffffU < 0xffffffff)) &&
     (this->fields->canUseFastFormat != false)) {
    doFastFormatInt32(this,(int32_t)number,SUB81((ulong)number >> 0x3f,0),appendTo);
  }
  else {
    icu_63::number::LocalizedNumberFormatter::formatInt
              ((LocalizedNumberFormatter *)local_40,
               (int64_t)(this->fields->formatter).
                        super_LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>.ptr,
               (UErrorCode *)number);
    sVar1 = (appendTo->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      offset = (appendTo->fUnion).fFields.fLength;
    }
    else {
      offset = (int)sVar1 >> 5;
    }
    fieldPositionIteratorHelper((FormattedNumber *)local_40,posIter,offset,status);
    local_40._16_8_ = &PTR__UnicodeStringAppendable_003bf2c0;
    local_28 = appendTo;
    icu_63::number::FormattedNumber::appendTo
              ((FormattedNumber *)local_40,(Appendable *)(local_40 + 0x10));
    UnicodeStringAppendable::~UnicodeStringAppendable((UnicodeStringAppendable *)(local_40 + 0x10));
    icu_63::number::FormattedNumber::~FormattedNumber((FormattedNumber *)local_40);
  }
  return appendTo;
}

Assistant:

UnicodeString&
DecimalFormat::format(int64_t number, UnicodeString& appendTo, FieldPositionIterator* posIter,
                      UErrorCode& status) const {
    if (posIter == nullptr && fastFormatInt64(number, appendTo)) {
        return appendTo;
    }
    FormattedNumber output = fields->formatter->formatInt(number, status);
    fieldPositionIteratorHelper(output, posIter, appendTo.length(), status);
    auto appendable = UnicodeStringAppendable(appendTo);
    output.appendTo(appendable);
    return appendTo;
}